

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::sendBrokerErrorAck(CoreBroker *this,ActionMessage *command,int32_t errorCode)

{
  ushort uVar1;
  GlobalFederateId fedid;
  uint uVar2;
  byte *__src;
  bool bVar3;
  route_id rVar4;
  string *psVar5;
  char *pcVar6;
  size_t sVar7;
  string_view str;
  ActionMessage badInit;
  ActionMessage local_e8;
  
  fedid.gid = (command->source_id).gid;
  if (((fedid.gid == -2010000000) || (fedid.gid == 0)) || (fedid.gid == -1700000000)) {
    uVar1 = command->flags;
    uVar2 = this->routeCount;
    this->routeCount = uVar2 + 1;
    rVar4.rid = uVar2 + 0xa000000;
    if ((uVar1 & 0x40) == 0) {
      rVar4.rid = uVar2;
    }
    uVar2 = (command->dest_handle).hid;
    psVar5 = ActionMessage::getString_abi_cxx11_(command,0);
    (*(this->super_Broker)._vptr_Broker[0x24])
              (this,(ulong)(uint)rVar4.rid,(ulong)uVar2,psVar5->_M_string_length,
               (psVar5->_M_dataplus)._M_p);
    bVar3 = true;
  }
  else {
    rVar4 = getRoute(this,fedid);
    bVar3 = false;
  }
  ActionMessage::ActionMessage(&local_e8,cmd_broker_ack);
  local_e8.flags._0_1_ = (byte)local_e8.flags | 0x10;
  local_e8.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  local_e8.payload.bufferSize = (command->payload).bufferSize;
  __src = (command->payload).heap;
  if ((local_e8.payload.heap != __src) &&
     (SmallBuffer::reserve(&local_e8.payload,local_e8.payload.bufferSize),
     local_e8.payload.bufferSize != 0)) {
    memcpy(local_e8.payload.heap,__src,local_e8.payload.bufferSize);
  }
  local_e8.messageID = errorCode;
  if (errorCode == 9) {
    pcVar6 = "broker key does not match";
    sVar7 = 0x19;
  }
  else {
    if (errorCode != 0xe) goto LAB_00338c5b;
    pcVar6 = "broker is terminating";
    sVar7 = 0x15;
  }
  str._M_str = pcVar6;
  str._M_len = sVar7;
  ActionMessage::setString(&local_e8,0,str);
LAB_00338c5b:
  (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)(uint)rVar4.rid,&local_e8);
  if (bVar3) {
    (*(this->super_Broker)._vptr_Broker[0x25])(this,(ulong)(uint)rVar4.rid);
  }
  ActionMessage::~ActionMessage(&local_e8);
  return;
}

Assistant:

void CoreBroker::sendBrokerErrorAck(ActionMessage& command, std::int32_t errorCode)
{
    route_id newroute;
    bool route_created = false;
    const bool jsonReply = checkActionFlag(command, use_json_serialization_flag);
    if ((!command.source_id.isValid()) || (command.source_id == parent_broker_id)) {
        newroute = generateRouteId(jsonReply ? json_route_code : 0, routeCount++);
        addRoute(newroute, command.getExtraData(), command.getString(targetStringLoc));
        route_created = true;
    } else {
        newroute = getRoute(command.source_id);
    }
    ActionMessage badInit(CMD_BROKER_ACK);
    setActionFlag(badInit, error_flag);
    badInit.source_id = global_broker_id_local;
    badInit.name(command.name());
    badInit.messageID = errorCode;
    switch (errorCode) {
        case broker_terminating:
            badInit.setString(0, "broker is terminating");
            break;
        case mismatch_broker_key_error_code:
            badInit.setString(0, "broker key does not match");
            break;
        default:
            break;
    }
    transmit(newroute, badInit);

    if (route_created) {
        removeRoute(newroute);
    }
}